

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O2

bool __thiscall
helics::PublicationInfo::CheckSetValue
          (PublicationInfo *this,char *dataToCheck,uint64_t len,Time currentTime,
          bool forceChangeCheck)

{
  long lVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  
  lVar1 = (this->minTimeGap).internalTimeCode;
  if ((lVar1 < 1) ||
     (lVar1 <= currentTime.internalTimeCode - (this->lastPublishTime).internalTimeCode)) {
    if ((forceChangeCheck | this->only_update_on_change) == 1) {
      __y._M_str = (char *)(this->data).heap;
      __y._M_len = (this->data).bufferSize;
      __x._M_str = dataToCheck;
      __x._M_len = len;
      bVar2 = std::operator==(__x,__y);
      if (bVar2) goto LAB_002784cd;
LAB_002784db:
      SmallBuffer::assign(&this->data,dataToCheck,len);
    }
    else if (this->buffer_data == true) goto LAB_002784db;
    (this->lastPublishTime).internalTimeCode = currentTime.internalTimeCode;
    bVar2 = true;
  }
  else {
LAB_002784cd:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PublicationInfo::CheckSetValue(const char* dataToCheck,
                                    uint64_t len,
                                    Time currentTime,
                                    bool forceChangeCheck)
{
    if (minTimeGap > timeZero) {
        if (currentTime - lastPublishTime < minTimeGap) {
            return false;
        }
    }
    if (only_update_on_change || forceChangeCheck) {
        if (std::string_view(dataToCheck, len) != data.to_string()) {
            data.assign(dataToCheck, len);
        } else {
            return false;
        }
    } else if (buffer_data) {
        data.assign(dataToCheck, len);
    }
    lastPublishTime = currentTime;
    return true;
}